

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O1

void __thiscall
leveldb::Constructor::Finish
          (Constructor *this,Options *options,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys,KVMap *kvmap)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Link_type p_Var3;
  _Link_type p_Var4;
  _Rb_tree_node_base *p_Var5;
  Tester *this_00;
  _Link_type p_Var6;
  KVMap *__range2;
  Status s;
  Status local_200;
  Options *local_1f8;
  string local_1f0;
  undefined1 local_1d0 [24];
  stringstream local_1b8 [392];
  
  if (&this->data_ != kvmap) {
    local_1d0._0_8_ = (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
    if ((_Link_type)local_1d0._0_8_ == (_Link_type)0x0) {
      local_1d0._8_8_ = (_Base_ptr)0x0;
    }
    else {
      (((_Link_type)local_1d0._0_8_)->super__Rb_tree_node_base)._M_parent = (_Base_ptr)0x0;
      local_1d0._8_8_ = p_Var2->_M_left;
      if ((_Base_ptr)local_1d0._8_8_ == (_Base_ptr)0x0) {
        local_1d0._8_8_ = p_Var2;
      }
    }
    p_Var1 = &(kvmap->_M_t)._M_impl.super__Rb_tree_header;
    (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    (kvmap->_M_t)._M_impl.super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>.
    _M_key_compare.cmp =
         (this->data_)._M_t._M_impl.
         super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>._M_key_compare.cmp;
    p_Var3 = (_Link_type)(this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_1d0._16_8_ = kvmap;
    if (p_Var3 != (_Link_type)0x0) {
      p_Var4 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,leveldb::(anonymous_namespace)::STLLessThan,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               ::
               _M_copy<false,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,leveldb::(anonymous_namespace)::STLLessThan,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::_Reuse_or_alloc_node>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,leveldb::(anonymous_namespace)::STLLessThan,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                           *)kvmap,p_Var3,&p_Var1->_M_header,(_Reuse_or_alloc_node *)local_1d0);
      p_Var3 = p_Var4;
      do {
        p_Var6 = p_Var3;
        p_Var3 = (_Link_type)(p_Var6->super__Rb_tree_node_base)._M_left;
      } while (p_Var3 != (_Link_type)0x0);
      (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var6->super__Rb_tree_node_base;
      p_Var3 = p_Var4;
      do {
        p_Var6 = p_Var3;
        p_Var3 = (_Link_type)(p_Var6->super__Rb_tree_node_base)._M_right;
      } while (p_Var3 != (_Link_type)0x0);
      (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var6->super__Rb_tree_node_base;
      (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
           (this->data_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           &p_Var4->super__Rb_tree_node_base;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_1d0._16_8_,(_Link_type)local_1d0._0_8_);
  }
  local_1f8 = options;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(keys);
  p_Var1 = &(this->data_)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var5 = (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(keys,(value_type *)(p_Var5 + 1));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase(&(this->data_)._M_t,
             (_Link_type)(this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (*this->_vptr_Constructor[2])(&local_200,this,local_1f8,kvmap);
  local_1d0[0] = 1;
  local_1d0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
  ;
  local_1d0._16_4_ = 0xa0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  this_00 = test::Tester::Is((Tester *)local_1d0,local_200.state_ == (char *)0x0,"s.ok()");
  Status::ToString_abi_cxx11_(&local_1f0,&local_200);
  test::Tester::operator<<(this_00,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1d0);
  if (local_200.state_ != (char *)0x0) {
    operator_delete__(local_200.state_);
  }
  return;
}

Assistant:

void Finish(const Options& options, std::vector<std::string>* keys,
              KVMap* kvmap) {
    *kvmap = data_;
    keys->clear();
    for (const auto& kvp : data_) {
      keys->push_back(kvp.first);
    }
    data_.clear();
    Status s = FinishImpl(options, *kvmap);
    ASSERT_TRUE(s.ok()) << s.ToString();
  }